

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::RequestImpl(CServerBrowser *this,NETADDR *Addr,CServerEntry *pEntry)

{
  long lVar1;
  int *piVar2;
  int64 iVar3;
  long in_FS_OFFSET;
  CSendCBData Data;
  CPacker Packer;
  CNetChunk Packet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pConfig->m_Debug != 0) {
    net_addr_str(Addr,(char *)&Packet,0x30,1);
    str_format((char *)&Packer,0x100,"requesting server info from %s",&Packet);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,2,"client_srvbrowse",&Packer,0);
  }
  CPacker::Reset(&Packer);
  CPacker::AddRaw(&Packer,SERVERBROWSE_GETINFO,8);
  piVar2 = &pEntry->m_CurrentToken;
  if (pEntry == (CServerEntry *)0x0) {
    piVar2 = &this->m_CurrentLanToken;
  }
  CPacker::AddInt(&Packer,*piVar2);
  Packet.m_ClientID = -1;
  Packet.m_Address.type = Addr->type;
  Packet.m_Address.ip[0] = Addr->ip[0];
  Packet.m_Address.ip[1] = Addr->ip[1];
  Packet.m_Address.ip[2] = Addr->ip[2];
  Packet.m_Address.ip[3] = Addr->ip[3];
  Packet.m_Address.ip._4_8_ = *(undefined8 *)(Addr->ip + 4);
  Packet.m_Address._16_8_ = *(undefined8 *)(Addr->ip + 0xc);
  Packet.m_Flags = 2;
  Packet.m_DataSize = (int)Packer.m_pCurrent - (int)&Packer;
  Data.m_pfnCallback = CBFTrackPacket;
  Data.m_pCallbackUser = this;
  Packet.m_pData = &Packer;
  CNetClient::Send(this->m_pNetClient,&Packet,0xffffffff,&Data);
  if (pEntry != (CServerEntry *)0x0) {
    pEntry->m_TrackID = Data.m_TrackID;
    iVar3 = time_get();
    pEntry->m_RequestTime = iVar3;
    pEntry->m_InfoState = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::RequestImpl(const NETADDR &Addr, CServerEntry *pEntry)
{
	if(Config()->m_Debug)
	{
		char aAddrStr[NETADDR_MAXSTRSIZE];
		net_addr_str(&Addr, aAddrStr, sizeof(aAddrStr), true);
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf),"requesting server info from %s", aAddrStr);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	CPacker Packer;
	Packer.Reset();
	Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
	Packer.AddInt(pEntry ? pEntry->m_CurrentToken : m_CurrentLanToken);

	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = Packer.Size();
	Packet.m_pData = Packer.Data();
	CSendCBData Data;
	Data.m_pfnCallback = CBFTrackPacket;
	Data.m_pCallbackUser = this;
	m_pNetClient->Send(&Packet, NET_TOKEN_NONE, &Data);

	if(pEntry)
	{
		pEntry->m_TrackID = Data.m_TrackID;
		pEntry->m_RequestTime = time_get();
		pEntry->m_InfoState = CServerEntry::STATE_PENDING;
	}
}